

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall
Inline::InlinePolymorphicFunctionUsingFixedMethods
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,StackSym *symCallerThis,
          ProfileId profileId,PropertySymOpnd *methodValueOpnd,bool *pIsInlined,
          uint recursiveInlineDepth)

{
  OpCode OVar1;
  Func *pFVar2;
  code *pcVar3;
  Inline *this_00;
  bool bVar4;
  ArgSlot AVar5;
  uint16 cachedFixedInlineeCount;
  uint uVar6;
  TypeId TVar7;
  FunctionJITTimeInfo *pFVar8;
  undefined4 *puVar9;
  SymOpnd *pSVar10;
  StackSym *pSVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  RegOpnd *pRVar15;
  char16 *pcVar16;
  Instr *pIVar17;
  PropertySymOpnd *pPVar18;
  Instr *pIVar19;
  PropertySymOpnd *fixedFunctionInfoArray;
  intptr_t iVar20;
  FixedFieldInfo *pFVar21;
  intptr_t iVar22;
  Instr *pIVar23;
  Opnd *this_01;
  char16 *pcVar24;
  LabelInstr *instr;
  LabelInstr *branchTarget;
  AddrOpnd *pAVar25;
  FunctionJITRuntimeInfo *inlineeRuntimeData;
  JITType *pJVar26;
  BranchInstr *pBVar27;
  JITTypeHolder JVar28;
  char16_t *pcVar29;
  undefined **this_02;
  char *pcVar30;
  ProfileId profileId_00;
  undefined6 in_register_00000082;
  int iVar31;
  uint i;
  uint uVar32;
  uint uVar33;
  wchar local_198 [4];
  char16 debugStringBuffer2 [42];
  wchar local_138 [4];
  char16 debugStringBuffer [42];
  FunctionJITTimeInfo *pFStack_d8;
  FunctionJITTimeInfo *inlineesDataArray [4];
  JITTypeHolderBase<void> local_a0;
  Instr *local_98;
  PropertySymOpnd *local_90;
  char16 *local_88;
  LabelInstr *local_80;
  StackSym *local_78;
  Instr *local_70;
  uint local_64;
  PropertySymOpnd *local_60;
  Inline *local_58;
  RegOpnd *local_50;
  RegOpnd *local_48;
  FunctionJITTimeInfo *local_40;
  bool local_31 [8];
  bool safeThis;
  
  pIVar19 = callInstr->m_next;
  *pIsInlined = false;
  local_60 = methodValueOpnd;
  local_58 = this;
  local_40 = inlinerData;
  pFVar8 = FunctionJITTimeInfo::GetInlinee(inlinerData,profileId);
  local_78 = symCallerThis;
  if (pFVar8 == (FunctionJITTimeInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x2d5,"(inlineeJitTimeData)","inlineeJitTimeData");
    if (!bVar4) goto LAB_004ff5cf;
    *puVar9 = 0;
  }
  local_50 = (RegOpnd *)pFVar8;
  pFVar8 = FunctionJITTimeInfo::GetNext(pFVar8);
  if (pFVar8 == (FunctionJITTimeInfo *)0x0) {
    pcVar29 = (char16_t *)&DAT_014594b0;
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
    pRVar15 = local_50;
    if (!bVar4) goto LAB_004fe819;
    pJVar12 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_50);
    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                        ((FunctionJITTimeInfo *)pRVar15,(wchar (*) [42])local_138);
    pFVar8 = local_40;
    pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
    pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pcVar24 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_198);
    pcVar29 = 
    L"INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"
    ;
    Output::Print(L"INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                  ,pcVar13,pcVar14,pcVar16,pcVar24);
  }
  else {
    if ((callInstr->m_src2 != (Opnd *)0x0) &&
       (bVar4 = IR::Opnd::IsSymOpnd(callInstr->m_src2), bVar4)) {
      pSVar10 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
      pSVar11 = Sym::AsStackSym(pSVar10->m_sym);
      AVar5 = StackSym::GetArgSlotNum(pSVar11);
      if (0xf < AVar5) {
        pcVar29 = (char16_t *)&DAT_014594b0;
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
        pRVar15 = local_50;
        if (!bVar4) goto LAB_004fe819;
        pJVar12 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_50);
        local_58 = (Inline *)JITTimeFunctionBody::GetDisplayName(pJVar12);
        local_50 = (RegOpnd *)
                   FunctionJITTimeInfo::GetDebugNumberSet
                             ((FunctionJITTimeInfo *)pRVar15,(wchar (*) [42])local_138);
        pSVar10 = IR::Opnd::AsSymOpnd(callInstr->m_src2);
        pSVar11 = Sym::AsStackSym(pSVar10->m_sym);
        AVar5 = StackSym::GetArgSlotNum(pSVar11);
        pFVar8 = local_40;
        pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
        pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_198);
        pcVar29 = 
        L"INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
        ;
        Output::Print(L"INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"
                      ,local_58,local_50,(ulong)AVar5,0xf,pcVar13,pcVar14);
        goto LAB_004fe814;
      }
    }
    iVar31 = 0;
    pRVar15 = local_50;
    while (pRVar15 != (RegOpnd *)0x0) {
      pRVar15 = (RegOpnd *)FunctionJITTimeInfo::GetNext((FunctionJITTimeInfo *)pRVar15);
      iVar31 = iVar31 + -1;
    }
    local_48 = (RegOpnd *)CONCAT44(local_48._4_4_,(int)CONCAT62(in_register_00000082,profileId));
    if (0xfffffffc < -iVar31 - 5U) {
      *pIsInlined = true;
      pIVar17 = callInstr;
      do {
        do {
          pIVar17 = pIVar17->m_prev;
          OVar1 = pIVar17->m_opcode;
        } while (OVar1 == Ld_A);
      } while (OVar1 == ArgOut_A);
      if (OVar1 == StartCall) {
        local_98 = pIVar19;
        pRVar15 = IR::Opnd::AsRegOpnd(callInstr->m_src1);
        pSVar11 = Sym::AsStackSym(&pRVar15->m_sym->super_Sym);
        pIVar19 = (pSVar11->field_5).m_instrDef;
        if ((pSVar11->field_0x18 & pIVar19 != (Instr *)0x0) == 0) {
          pIVar19 = InlinePolymorphicFunction
                              (local_58,callInstr,local_40,local_78,(ProfileId)local_48,pIsInlined,
                               recursiveInlineDepth,true);
          return pIVar19;
        }
        bVar4 = IR::Opnd::IsSymOpnd(pIVar19->m_src1);
        if (bVar4) {
          pSVar10 = IR::Opnd::AsSymOpnd(pIVar19->m_src1);
          bVar4 = IR::SymOpnd::IsPropertySymOpnd(pSVar10);
          if (bVar4) {
            pPVar18 = IR::Opnd::AsPropertySymOpnd(pIVar19->m_src1);
            if (pPVar18->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
              bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
              pRVar15 = local_50;
              pSVar11 = local_78;
              pIVar19 = callInstr;
              profileId_00 = (ProfileId)local_48;
              if (!bVar4) goto LAB_004feb1a;
              pJVar12 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_50);
              pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
              pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                                  ((FunctionJITTimeInfo *)pRVar15,(wchar (*) [42])local_138);
              pFVar8 = local_40;
              pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
              pcVar24 = JITTimeFunctionBody::GetDisplayName(pJVar12);
              pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_198);
              pcVar29 = 
              L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no ObjTypeSpecFldInfo to get Fixed Methods from Inlinee: %s (%s):\tCaller: %s (%s)\n"
              ;
            }
            else {
              bVar4 = IR::PropertySymOpnd::HasFixedValue(pPVar18);
              if (bVar4) {
                local_80 = (LabelInstr *)CONCAT44(local_80._4_4_,-iVar31);
                local_70 = callInstr;
                cachedFixedInlineeCount = IR::PropertySymOpnd::GetFixedFieldCount(pPVar18);
                uVar33 = (uint)cachedFixedInlineeCount;
                if (1 < cachedFixedInlineeCount) {
                  local_88 = (char16 *)CONCAT62(local_88._2_6_,cachedFixedInlineeCount);
                  local_90 = pPVar18;
                  fixedFunctionInfoArray =
                       (PropertySymOpnd *)IR::PropertySymOpnd::GetFixedFieldInfoArray(pPVar18);
                  uVar6 = HandleDifferentTypesSameFunction
                                    ((Inline *)pPVar18,(FixedFieldInfo *)fixedFunctionInfoArray,
                                     cachedFixedInlineeCount);
                  pSVar11 = local_78;
                  if (iVar31 + uVar6 != 0) {
                    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
                    pRVar15 = local_50;
                    pSVar11 = local_78;
                    pIVar19 = local_70;
                    profileId_00 = (ProfileId)local_48;
                    if (bVar4) {
                      pJVar12 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_50);
                      local_60 = (PropertySymOpnd *)JITTimeFunctionBody::GetDisplayName(pJVar12);
                      local_50 = (RegOpnd *)
                                 FunctionJITTimeInfo::GetDebugNumberSet
                                           ((FunctionJITTimeInfo *)pRVar15,(wchar (*) [42])local_138
                                           );
                      pFVar8 = local_40;
                      pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
                      pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
                      pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                                          (pFVar8,(wchar (*) [42])local_198);
                      profileId_00 = (ProfileId)local_48;
                      Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: cached fixed function count (%d) doesn\'t match inlinee count (%d); (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                                    ,(ulong)uVar6,(ulong)local_80 & 0xffffffff,4,local_60,local_50,
                                    pcVar13,pcVar14);
                      Output::Flush();
                      pIVar19 = local_70;
                    }
                    goto LAB_004feb1a;
                  }
                  local_60 = fixedFunctionInfoArray;
                  if ((ushort)local_88 < 5) {
                    this_02 = &PTR_013e5f18;
                    local_64 = uVar33;
                    puVar9 = (undefined4 *)__tls_get_addr();
                  }
                  else {
                    AssertCount = AssertCount + 1;
                    local_64 = uVar33;
                    Js::Throw::LogAssert();
                    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                    *puVar9 = 1;
                    pcVar30 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                    ;
                    bVar4 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                       ,0x359,
                                       "(cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize)"
                                       ,
                                       "cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize"
                                      );
                    if (!bVar4) goto LAB_004ff5cf;
                    *puVar9 = 0;
                    this_02 = (undefined **)pcVar30;
                  }
                  pIVar17 = local_98;
                  inlineesDataArray[1] = (FunctionJITTimeInfo *)0x0;
                  inlineesDataArray[2] = (FunctionJITTimeInfo *)0x0;
                  pFStack_d8 = (FunctionJITTimeInfo *)0x0;
                  inlineesDataArray[0] = (FunctionJITTimeInfo *)0x0;
                  FillInlineesDataArrayUsingFixedMethods
                            ((Inline *)this_02,(FunctionJITTimeInfo *)local_50,&pFStack_d8,4,
                             (FixedFieldInfo *)local_60,(uint16)local_64);
                  uVar33 = 0;
                  while (pFVar8 = pFStack_d8, uVar33 < local_64) {
                    pFVar8 = inlineesDataArray[(ulong)uVar33 - 1];
                    if ((pFVar8 == (FunctionJITTimeInfo *)0x0) ||
                       (bVar4 = FunctionJITTimeInfo::HasBody(pFVar8), !bVar4)) {
                      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
                      pFVar8 = local_40;
                      profileId_00 = (ProfileId)local_48;
                      pIVar19 = local_70;
                      if (bVar4) {
                        pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
                        pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
                        pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                                            (pFVar8,(wchar (*) [42])local_138);
                        Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: One of the inlinees doesn\'t have the corresponding object/prototype\'s type cached\tCaller: %s (%s)\n"
                                      ,pcVar13,pcVar14);
                        Output::Flush();
                        pIVar19 = local_70;
                      }
                      goto LAB_004feb1a;
                    }
                    pJVar12 = FunctionJITTimeInfo::GetBody(pFVar8);
                    pPVar18 = local_60;
                    if (pJVar12 != (JITTimeFunctionBody *)0x0) {
                      iVar20 = FunctionJITTimeInfo::GetFunctionInfoAddr(pFVar8);
                      pFVar21 = IR::PropertySymOpnd::GetFixedFunction(local_90,uVar33);
                      iVar22 = FixedFieldInfo::GetFuncInfoAddr(pFVar21);
                      pSVar11 = local_78;
                      pPVar18 = local_60;
                      if (iVar20 != iVar22) {
                        AssertCount = AssertCount + 1;
                        Js::Throw::LogAssert();
                        *puVar9 = 1;
                        bVar4 = Js::Throw::ReportAssert
                                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                           ,0x369,"(false)",
                                           "inlineesDataArray and fixedfunctionInfoArray should be aligned with each other at this point"
                                          );
                        if (!bVar4) goto LAB_004ff5cf;
                        *puVar9 = 0;
                        pPVar18 = local_60;
                      }
                    }
                    do {
                      bVar4 = FixedFieldInfo::NextHasSameFixedField
                                        ((FixedFieldInfo *)
                                         ((Type *)&pPVar18->super_SymOpnd + uVar33));
                      uVar33 = uVar33 + 1;
                    } while (bVar4);
                  }
                  local_31[0] = true;
                  uVar33 = 0;
                  while (uVar33 < local_64) {
                    iVar20 = IR::PropertySymOpnd::GetFieldValue(local_90,uVar33);
                    pPVar18 = local_90;
                    if (iVar20 == 0) {
                      profileId_00 = (ProfileId)local_48;
                      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
                      pSVar11 = local_78;
                      pIVar19 = local_70;
                      if (bVar4) {
                        pFVar8 = inlineesDataArray[(ulong)uVar33 - 1];
                        pJVar12 = FunctionJITTimeInfo::GetBody(pFVar8);
                        pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
                        pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                                            (pFVar8,(wchar (*) [42])local_138);
                        pFVar8 = local_40;
                        pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
                        pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar12);
                        pcVar24 = FunctionJITTimeInfo::GetDebugNumberSet
                                            (pFVar8,(wchar (*) [42])local_198);
                        Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no fixed method for one of the inlinees; Inlinee: %s (%s):\tCaller: %s (%s)\n"
                                      ,pcVar13,pcVar14,pcVar16,pcVar24);
                        Output::Flush();
                        pSVar11 = local_78;
                        pIVar19 = local_70;
                      }
                      goto LAB_004feb1a;
                    }
                    if (uVar33 == 0) {
                      bVar4 = TryOptimizeCallInstrWithFixedMethod
                                        (local_58,local_70,pFVar8,true,false,false,true,local_31,
                                         true,0);
                      pPVar18 = local_90;
                      if (!bVar4) {
LAB_004ff2bc:
                        profileId_00 = (ProfileId)local_48;
                        bVar4 = Js::Phases::IsEnabled
                                          ((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
                        pRVar15 = local_50;
                        pSVar11 = local_78;
                        pIVar19 = local_70;
                        if (!bVar4) goto LAB_004feb1a;
                        pJVar12 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_50);
                        local_60 = (PropertySymOpnd *)JITTimeFunctionBody::GetDisplayName(pJVar12);
                        pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                            ((FunctionJITTimeInfo *)pRVar15,
                                             (wchar (*) [42])local_138);
                        pFVar8 = local_40;
                        pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
                        pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
                        pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                                            (pFVar8,(wchar (*) [42])local_198);
                        pcVar29 = 
                        L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can\'t optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                        ;
                        uVar33 = (uint)local_80;
                        goto LAB_004fe995;
                      }
                    }
                    else {
                      pFVar21 = IR::PropertySymOpnd::GetFixedFunction(local_90,uVar33);
                      if (pFVar21 != (FixedFieldInfo *)0x0) {
                        pFVar21 = IR::PropertySymOpnd::GetFixedFunction(pPVar18,uVar33);
                        local_88 = (char16 *)FixedFieldInfo::GetFuncInfoAddr(pFVar21);
                        pcVar13 = (char16 *)
                                  FunctionJITTimeInfo::GetFunctionInfoAddr
                                            (inlineesDataArray[(ulong)uVar33 - 1]);
                        if (local_88 != pcVar13) goto LAB_004ff2bc;
                      }
                    }
                    TVar7 = IR::PropertySymOpnd::GetTypeId(pPVar18,uVar33);
                    pPVar18 = local_60;
                    if (0x3a < TVar7 - TypeIds_HostDispatch) {
                      local_31[0] = false;
                    }
                    do {
                      bVar4 = FixedFieldInfo::NextHasSameFixedField
                                        ((FixedFieldInfo *)
                                         ((Type *)&pPVar18->super_SymOpnd + uVar33));
                      uVar33 = uVar33 + 1;
                    } while (bVar4);
                  }
                  bVar4 = IR::PropertySymOpnd::IsPoly(local_90);
                  pIVar23 = local_70;
                  if (!bVar4) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar9 = 1;
                    bVar4 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                       ,0x3a0,"(methodPropertyOpnd->IsPoly())",
                                       "methodPropertyOpnd->IsPoly()");
                    if (!bVar4) {
LAB_004ff5cf:
                      pcVar3 = (code *)invalidInstructionException();
                      (*pcVar3)();
                    }
                    *puVar9 = 0;
                  }
                  local_50 = IR::RegOpnd::New(TyVar,pIVar23->m_func);
                  pIVar23 = IR::Instr::New(CheckPropertyGuardAndLoadType,&local_50->super_Opnd,
                                           pIVar19->m_src1,pIVar23->m_func);
                  IR::Instr::InsertBefore(pIVar19,pIVar23);
                  IR::Instr::SetByteCodeOffset(pIVar23,pIVar19);
                  IR::Instr::ConvertToBailOutInstr
                            (pIVar23,pIVar19,BailOutFailedFixedFieldCheck,0xffffffff);
                  local_48 = (RegOpnd *)&DAT_014594b0;
                  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
                  if (bVar4) {
                    Output::Print(L"------------------------------------------------\n");
                    Output::Flush();
                  }
                  uVar33 = local_64;
                  uVar32 = 0;
                  while (uVar32 < uVar33) {
                    pFVar8 = inlineesDataArray[(ulong)uVar32 - 1];
                    pJVar12 = FunctionJITTimeInfo::GetBody(pFVar8);
                    bVar4 = Js::Phases::IsEnabled((Phases *)local_48,PolymorphicInlinePhase);
                    pPVar18 = local_60;
                    if (bVar4) {
                      local_80 = (LabelInstr *)JITTimeFunctionBody::GetDisplayName(pJVar12);
                      local_88 = FunctionJITTimeInfo::GetDebugNumberSet
                                           (pFVar8,(wchar (*) [42])local_138);
                      pFVar8 = local_40;
                      pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
                      JITTimeFunctionBody::GetDisplayName(pJVar12);
                      FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_198);
                      Output::Print(L"INLINING (Polymorphic; Using Fixed Methods): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"
                                    ,local_80,local_88);
                      Output::Flush();
                      pPVar18 = local_60;
                    }
                    do {
                      bVar4 = FixedFieldInfo::NextHasSameFixedField
                                        ((FixedFieldInfo *)
                                         ((Type *)&pPVar18->super_SymOpnd + uVar32));
                      uVar32 = uVar32 + 1;
                    } while (bVar4);
                  }
                  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
                  if (bVar4) {
                    Output::Print(L"------------------------------------------------\n");
                    Output::Flush();
                  }
                  uVar33 = 0;
                  if (local_70->m_dst == (Opnd *)0x0) {
                    local_48 = (RegOpnd *)0x0;
                  }
                  else {
                    this_01 = IR::Instr::UnlinkDst(local_70);
                    local_48 = IR::Opnd::AsRegOpnd(this_01);
                  }
                  pIVar23 = local_70;
                  IR::Instr::MoveArgs(local_70,true);
                  pIVar23->m_opcode = CallIFixed;
                  local_80 = IR::LabelInstr::New(Label,pIVar23->m_func,false);
                  instr = IR::LabelInstr::New(Label,pIVar23->m_func,false);
                  IR::Instr::InsertBefore(pIVar23,&instr->super_Instr);
                  pPVar18 = local_90;
                  local_88 = (char16 *)(ulong)(local_31[0] & 1);
                  for (; pIVar23 = local_70, uVar33 < local_64; uVar33 = uVar33 + 1) {
                    branchTarget = IR::LabelInstr::New(Label,local_70->m_func,false);
                    IR::Instr::InsertBefore(pIVar23,&branchTarget->super_Instr);
                    iVar20 = IR::PropertySymOpnd::GetFieldValue(pPVar18,uVar33);
                    pAVar25 = IR::AddrOpnd::New(iVar20,AddrOpndKindDynamicVar,pIVar23->m_func,false,
                                                (Var)0x0);
                    pAVar25->field_0x28 = pAVar25->field_0x28 | 2;
                    pFVar21 = IR::PropertySymOpnd::GetFixedFieldInfoArray(pPVar18);
                    pAVar25->m_metadata = pFVar21 + uVar33;
                    local_40 = inlineesDataArray[(ulong)uVar33 - 1];
                    inlineeRuntimeData = FunctionJITTimeInfo::GetRuntimeInfo(local_40);
                    InsertOneInlinee(local_58,local_70,local_48,&pAVar25->super_Opnd,local_40,
                                     inlineeRuntimeData,local_80,local_78,SUB81(local_88,0),
                                     recursiveInlineDepth);
                    while (bVar4 = FixedFieldInfo::NextHasSameFixedField
                                             ((FixedFieldInfo *)
                                              ((Type *)&local_60->super_SymOpnd + uVar33)), bVar4) {
                      local_a0.t = (Type)IR::PropertySymOpnd::GetType(pPVar18,uVar33);
                      pJVar26 = JITTypeHolderBase<void>::operator->(&local_a0);
                      iVar20 = JITType::GetAddr(pJVar26);
                      pAVar25 = IR::AddrOpnd::New(iVar20,AddrOpndKindDynamicType,
                                                  (instr->super_Instr).m_func,false,(Var)0x0);
                      pBVar27 = IR::BranchInstr::New
                                          (BrAddr_A,branchTarget,&local_50->super_Opnd,
                                           &pAVar25->super_Opnd,(instr->super_Instr).m_func);
                      IR::Instr::InsertBefore(&instr->super_Instr,&pBVar27->super_Instr);
                      pFVar2 = local_58->topFunc;
                      JVar28 = IR::PropertySymOpnd::GetType(pPVar18,uVar33);
                      Func::PinTypeRef(pFVar2,JVar28.t);
                      uVar33 = uVar33 + 1;
                    }
                    local_a0.t = (Type)IR::PropertySymOpnd::GetType(pPVar18,uVar33);
                    pJVar26 = JITTypeHolderBase<void>::operator->(&local_a0);
                    iVar20 = JITType::GetAddr(pJVar26);
                    pAVar25 = IR::AddrOpnd::New(iVar20,AddrOpndKindDynamicType,
                                                (instr->super_Instr).m_func,false,(Var)0x0);
                    pBVar27 = IR::BranchInstr::New
                                        (BrAddr_A,branchTarget,&local_50->super_Opnd,
                                         &pAVar25->super_Opnd,(instr->super_Instr).m_func);
                    IR::Instr::InsertBefore(&instr->super_Instr,&pBVar27->super_Instr);
                    pFVar2 = local_58->topFunc;
                    JVar28 = IR::PropertySymOpnd::GetType(pPVar18,uVar33);
                    Func::PinTypeRef(pFVar2,JVar28.t);
                    pIVar17 = local_98;
                  }
                  pIVar23 = pIVar19;
                  IR::Instr::Unlink(pIVar19);
                  pIVar19->m_opcode = LdMethodFldPolyInlineMiss;
                  CompletePolymorphicInlining
                            ((Inline *)pIVar23,local_70,local_48,local_80,&instr->super_Instr,
                             pIVar19,BailOutOnFailedPolymorphicInlineTypeCheck);
                  this_00 = local_58;
                  Func::SetHasInlinee(local_58->topFunc);
                  InsertStatementBoundary(this_00,pIVar17);
                  InsertStatementBoundary(this_00,pIVar19);
                  return pIVar17;
                }
                local_64 = uVar33;
                bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
                pRVar15 = local_50;
                profileId_00 = (ProfileId)local_48;
                pSVar11 = local_78;
                pIVar19 = local_70;
                if (bVar4) {
                  pJVar12 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_50);
                  local_60 = (PropertySymOpnd *)JITTimeFunctionBody::GetDisplayName(pJVar12);
                  pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                                      ((FunctionJITTimeInfo *)pRVar15,(wchar (*) [42])local_138);
                  pFVar8 = local_40;
                  pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
                  pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
                  pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_198)
                  ;
                  pcVar29 = 
                  L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: fixed function count too less %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                  ;
                  uVar33 = local_64;
LAB_004fe995:
                  Output::Print(pcVar29,(ulong)uVar33,4,local_60,pcVar13,pcVar14,pcVar16);
                  Output::Flush();
                  pSVar11 = local_78;
                  pIVar19 = local_70;
                }
                goto LAB_004feb1a;
              }
              bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
              pRVar15 = local_50;
              pSVar11 = local_78;
              pIVar19 = callInstr;
              profileId_00 = (ProfileId)local_48;
              if (!bVar4) goto LAB_004feb1a;
              pJVar12 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_50);
              pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
              pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                                  ((FunctionJITTimeInfo *)pRVar15,(wchar (*) [42])local_138);
              pFVar8 = local_40;
              pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
              pcVar24 = JITTimeFunctionBody::GetDisplayName(pJVar12);
              pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_198);
              pcVar29 = 
              L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ObjTypeSpecFldInfo doesn\'t have Fixed Methods for one or some of the inlinees Inlinee: %s (%s):\tCaller: %s (%s)\n"
              ;
            }
            goto LAB_004feae1;
          }
        }
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
        pRVar15 = local_50;
        pSVar11 = local_78;
        pIVar19 = callInstr;
        profileId_00 = (ProfileId)local_48;
        if (!bVar4) goto LAB_004feb1a;
        pJVar12 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_50);
        pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                            ((FunctionJITTimeInfo *)pRVar15,(wchar (*) [42])local_138);
        pFVar8 = local_40;
        pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
        pcVar24 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_198);
        pcVar29 = 
        L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: Did not find property sym operand for the method load Inlinee: %s (%s):\tCaller: %s (%s)\n"
        ;
      }
      else {
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
        pRVar15 = local_50;
        pSVar11 = local_78;
        pIVar19 = callInstr;
        profileId_00 = (ProfileId)local_48;
        if (!bVar4) goto LAB_004feb1a;
        pJVar12 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_50);
        pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet
                            ((FunctionJITTimeInfo *)pRVar15,(wchar (*) [42])local_138);
        pFVar8 = local_40;
        pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
        pcVar24 = JITTimeFunctionBody::GetDisplayName(pJVar12);
        pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_198);
        pcVar29 = 
        L"INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ArgOuts may have side effects Inlinee: %s (%s):\tCaller: %s (%s)\n"
        ;
      }
LAB_004feae1:
      profileId_00 = (ProfileId)local_48;
      Output::Print(pcVar29,pcVar14,pcVar16,pcVar24,pcVar13);
      Output::Flush();
      pSVar11 = local_78;
      pIVar19 = callInstr;
LAB_004feb1a:
      pIVar19 = InlinePolymorphicFunction
                          (local_58,pIVar19,local_40,pSVar11,profileId_00,pIsInlined,
                           recursiveInlineDepth,true);
      return pIVar19;
    }
    pcVar29 = (char16_t *)&DAT_014594b0;
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,PolymorphicInlinePhase);
    pRVar15 = local_50;
    if (!bVar4) goto LAB_004fe819;
    pJVar12 = FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)local_50);
    local_58 = (Inline *)JITTimeFunctionBody::GetDisplayName(pJVar12);
    pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                        ((FunctionJITTimeInfo *)pRVar15,(wchar (*) [42])local_138);
    pFVar8 = local_40;
    pJVar12 = FunctionJITTimeInfo::GetBody(local_40);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar8,(wchar (*) [42])local_198);
    pcVar29 = 
    L"INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large: InlineeCount %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
    ;
    Output::Print(L"INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large: InlineeCount %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"
                  ,(ulong)(uint)-iVar31,4,local_58,pcVar13,pcVar14,pcVar16);
  }
LAB_004fe814:
  Output::Flush();
LAB_004fe819:
  pPVar18 = local_60;
  TryResetObjTypeSpecFldInfoOn((Inline *)pcVar29,local_60);
  TryDisableRuntimePolymorphicCacheOn((Inline *)pcVar29,pPVar18);
  return pIVar19;
}

Assistant:

IR::Instr *
Inline::InlinePolymorphicFunctionUsingFixedMethods(IR::Instr *callInstr, const FunctionJITTimeInfo * inlinerData, const StackSym *symCallerThis, const Js::ProfileId profileId, IR::PropertySymOpnd* methodValueOpnd, bool* pIsInlined, uint recursiveInlineDepth)
{
    IR::Instr* instrNext = callInstr->m_next;
    *pIsInlined = false;

    const FunctionJITTimeInfo* inlineeJitTimeData = inlinerData->GetInlinee(profileId);
    AnalysisAssert(inlineeJitTimeData);

#if defined(DBG_DUMP) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    // Abort conditions:
    if(!inlineeJitTimeData->GetNext())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Missing JitTime data \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                 inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                 inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        // There are no multiple codegen jit-time data allocated for this call site, not sure how is this possible, abort
        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    // arguments exceed MaxInlineeArgoutCount
    if (callInstr->GetSrc2() &&
        callInstr->GetSrc2()->IsSymOpnd() &&
        callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo. Although
        // InliningDecider already checks for this, the check is against profile data that may not be accurate since profile
        // data matching does not take into account some types of changes to source code. Need to check this again with current
        // information.
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: ArgSlot > MaxInlineeArgoutCount\tInlinee: %s (%s)\tArgSlotNum: %d\tMaxInlineeArgoutCount: %d\tCaller: %s (%s)\n"),
            inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer) , callInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum(),
            Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    uint inlineeCount = 0;
    const FunctionJITTimeInfo * tmpInlineeJitTimeData = inlineeJitTimeData;
    while(tmpInlineeJitTimeData)
    {
        inlineeCount++;
        tmpInlineeJitTimeData = tmpInlineeJitTimeData->GetNext();
    }

    // Inlinee count too small (<2) or too large (>4)
    if (inlineeCount < 2 || inlineeCount > Js::DynamicProfileInfo::maxPolymorphicInliningSize)
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic): Skip Inline: Inlinee count either too small or too large: InlineeCount %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        TryResetObjTypeSpecFldInfoOn(methodValueOpnd);
        TryDisableRuntimePolymorphicCacheOn(methodValueOpnd);
        return instrNext;
    }

    *pIsInlined = true;

    IR::Instr* tmpInstr = callInstr->m_prev;
    while (tmpInstr->m_opcode != Js::OpCode::StartCall)
    {
        if ((tmpInstr->m_opcode != Js::OpCode::ArgOut_A) && (tmpInstr->m_opcode != Js::OpCode::Ld_A))
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ArgOuts may have side effects Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
        tmpInstr = tmpInstr->m_prev;
    }

    StackSym* methodValueSym = callInstr->GetSrc1()->AsRegOpnd()->m_sym->AsStackSym();
    if (!methodValueSym->IsSingleDef())
    {
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    IR::Instr* ldMethodFldInstr = methodValueSym->GetInstrDef();
    if (!(ldMethodFldInstr->GetSrc1()->IsSymOpnd() && ldMethodFldInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()))
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: Did not find property sym operand for the method load Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    IR::PropertySymOpnd* methodPropertyOpnd = ldMethodFldInstr->GetSrc1()->AsPropertySymOpnd();
    if (!methodPropertyOpnd->HasObjTypeSpecFldInfo())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no ObjTypeSpecFldInfo to get Fixed Methods from Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    if (!methodPropertyOpnd->HasFixedValue())
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: ObjTypeSpecFldInfo doesn't have Fixed Methods for one or some of the inlinees Inlinee: %s (%s):\tCaller: %s (%s)\n"),

                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    uint16 cachedFixedInlineeCount = methodPropertyOpnd->GetFixedFieldCount();
    if (cachedFixedInlineeCount < 2)
    {
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: fixed function count too less %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    cachedFixedInlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    FixedFieldInfo* fixedFunctionInfoArray = methodPropertyOpnd->GetFixedFieldInfoArray();

    // It might so be the case that two objects of different types call the same function (body), for e.g., if they share the prototype on which the function is defined.
    uint uniqueFixedFunctionCount = HandleDifferentTypesSameFunction(fixedFunctionInfoArray, cachedFixedInlineeCount);

    if (uniqueFixedFunctionCount != inlineeCount)
    {
        // inlineeCount obtained from the inlineeJitTimeData is more accurate than cached number of fixed methods for inlinees.
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: cached fixed function count (%d) doesn't match inlinee count (%d); (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    uniqueFixedFunctionCount, inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
        return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
    }

    Assert(cachedFixedInlineeCount <= Js::DynamicProfileInfo::maxPolymorphicInliningSize);
    const FunctionJITTimeInfo* inlineesDataArray[Js::DynamicProfileInfo::maxPolymorphicInliningSize] = {};

    FillInlineesDataArrayUsingFixedMethods(inlineeJitTimeData, inlineesDataArray, Js::DynamicProfileInfo::maxPolymorphicInliningSize, fixedFunctionInfoArray, cachedFixedInlineeCount);

    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        if(!inlineesDataArray[i] || !inlineesDataArray[i]->HasBody())
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: One of the inlinees doesn't have the corresponding object/prototype's type cached\tCaller: %s (%s)\n"),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
#if DBG
        if(inlineesDataArray[i]->GetBody() && inlineesDataArray[i]->GetFunctionInfoAddr() != methodPropertyOpnd->GetFixedFunction(i)->GetFuncInfoAddr())
        {
            AssertMsg(false, "inlineesDataArray and fixedfunctionInfoArray should be aligned with each other at this point");
        }
#endif
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }

    bool safeThis = true; // Eliminate CheckThis for inlining.
    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        if (!methodPropertyOpnd->GetFieldValue(i))
        {
            POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: no fixed method for one of the inlinees; Inlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineesDataArray[i]->GetBody()->GetDisplayName(), inlineesDataArray[i]->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
            return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
        }
        if (i == 0)
        {
            // Do all the general, non-function-object-specific checks just once.
            if (!TryOptimizeCallInstrWithFixedMethod(callInstr, inlineesDataArray[i], true, false, false, true /*isInlined*/, safeThis, true /*dontOptimizeJustCheck*/, i))
            {
                POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can't optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
                return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth, true);
            }
        }
        else
        {
            if (methodPropertyOpnd->GetFixedFunction(i) &&
                methodPropertyOpnd->GetFixedFunction(i)->GetFuncInfoAddr() != inlineesDataArray[i]->GetFunctionInfoAddr())
            {
                POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Skip Inline: can't optimize using Fixed Methods %d (Max: %d)\tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeCount, Js::DynamicProfileInfo::maxPolymorphicInliningSize,
                    inlineeJitTimeData->GetBody()->GetDisplayName(), inlineeJitTimeData->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));
                return InlinePolymorphicFunction(callInstr, inlinerData, symCallerThis, profileId, pIsInlined, recursiveInlineDepth,  true);
            }
        }
        Js::TypeId typeId = methodPropertyOpnd->GetTypeId(i);
        if(!(typeId > Js::TypeIds_LastJavascriptPrimitiveType && typeId <= Js::TypeIds_LastTrueJavascriptObjectType))
        {
            // Don't eliminate CheckThis if it cannot be done for any one of the inlinees
            safeThis = false;
        }
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }

    Assert(methodPropertyOpnd->IsPoly());

    // emit property guard check for the method load, and load type
    IR::RegOpnd *typeOpnd = IR::RegOpnd::New(TyVar, callInstr->m_func);
    IR::Instr* propertyGuardCheckInstr = IR::Instr::New(Js::OpCode::CheckPropertyGuardAndLoadType, typeOpnd, ldMethodFldInstr->GetSrc1(), callInstr->m_func);
    ldMethodFldInstr->InsertBefore(propertyGuardCheckInstr);
    propertyGuardCheckInstr->SetByteCodeOffset(ldMethodFldInstr);
    propertyGuardCheckInstr = propertyGuardCheckInstr->ConvertToBailOutInstr(ldMethodFldInstr, IR::BailOutFailedFixedFieldCheck);

    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));
    for (uint i = 0; i < cachedFixedInlineeCount; i++)
    {
        JITTimeFunctionBody *inlineeFunctionBody = inlineesDataArray[i]->GetBody();
        POLYMORPHIC_INLINE_TESTTRACE(_u("INLINING (Polymorphic; Using Fixed Methods): Start inlining: \tInlinee: %s (%s):\tCaller: %s (%s)\n"),
                    inlineeFunctionBody->GetDisplayName(), inlineesDataArray[i]->GetDebugNumberSet(debugStringBuffer),
                    inlinerData->GetBody()->GetDisplayName(), inlinerData->GetDebugNumberSet(debugStringBuffer2));

        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            i++;
        }
    }
    POLYMORPHIC_INLINE_TESTTRACE(_u("------------------------------------------------\n"));

    IR::RegOpnd * returnValueOpnd;
    if (callInstr->GetDst())
    {
        returnValueOpnd = callInstr->UnlinkDst()->AsRegOpnd();
    }
    else
    {
        returnValueOpnd = nullptr;
    }

    callInstr->MoveArgs(/*generateByteCodeCapture*/ true);

    callInstr->m_opcode = Js::OpCode::CallIFixed;

    // iterate over inlineesDataArray to emit each inlinee
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    IR::Instr* dispatchStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func, false);
    callInstr->InsertBefore(dispatchStartLabel);
    for(uint i=0; i < cachedFixedInlineeCount; i++)
    {
        IR::LabelInstr* inlineeStartLabel = IR::LabelInstr::New(Js::OpCode::Label, callInstr->m_func);
        callInstr->InsertBefore(inlineeStartLabel);

        IR::AddrOpnd * constMethodValueOpnd = IR::AddrOpnd::New(methodPropertyOpnd->GetFieldValue(i), IR::AddrOpndKind::AddrOpndKindDynamicVar, callInstr->m_func);
        constMethodValueOpnd->m_isFunction = true;
        constMethodValueOpnd->m_metadata = &methodPropertyOpnd->GetFixedFieldInfoArray()[i];

        InsertOneInlinee(callInstr, returnValueOpnd, constMethodValueOpnd, inlineesDataArray[i], inlineesDataArray[i]->GetRuntimeInfo(), doneLabel, symCallerThis, safeThis, recursiveInlineDepth);
        while (fixedFunctionInfoArray[i].NextHasSameFixedField())
        {
            dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::BrAddr_A, inlineeStartLabel, typeOpnd, IR::AddrOpnd::New(methodPropertyOpnd->GetType(i)->GetAddr(),
                IR::AddrOpndKindDynamicType, dispatchStartLabel->m_func), dispatchStartLabel->m_func));
            this->topFunc->PinTypeRef(methodPropertyOpnd->GetType(i).t); // Keep the types alive as the types may not be equivalent and, hence, won't be kept alive by EquivalentTypeCache
            i++;
        }

        dispatchStartLabel->InsertBefore(IR::BranchInstr::New(Js::OpCode::BrAddr_A, inlineeStartLabel,
            typeOpnd, IR::AddrOpnd::New(methodPropertyOpnd->GetType(i)->GetAddr(), IR::AddrOpndKindDynamicType, dispatchStartLabel->m_func), dispatchStartLabel->m_func));
        this->topFunc->PinTypeRef(methodPropertyOpnd->GetType(i).t); // Keep the types alive as the types may not be equivalent and, hence, won't be kept alive by EquivalentTypeCache
    }

    ldMethodFldInstr->Unlink();
    ldMethodFldInstr->m_opcode = Js::OpCode::LdMethodFldPolyInlineMiss;
    Assert(cachedFixedInlineeCount > 0);
    CompletePolymorphicInlining(callInstr, returnValueOpnd, doneLabel, dispatchStartLabel, ldMethodFldInstr, IR::BailOutOnFailedPolymorphicInlineTypeCheck);

    this->topFunc->SetHasInlinee();
    InsertStatementBoundary(instrNext);
    InsertStatementBoundary(ldMethodFldInstr);

    return instrNext;
}